

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool __thiscall
caffe::LayerParameter::MergePartialFromCodedStream(LayerParameter *this,CodedInputStream *input)

{
  uint tag_00;
  CodedInputStream *pCVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  WireType WVar5;
  pair<unsigned_int,_bool> pVar6;
  string *psVar7;
  char *pcVar8;
  RepeatedField<float> *pRVar9;
  ParamSpec *value_00;
  BlobProto *value_01;
  NetStateRule *pNVar10;
  RepeatedField<bool> *pRVar11;
  TransformationParameter *value_02;
  LossParameter *value_03;
  AccuracyParameter *value_04;
  ArgMaxParameter *value_05;
  ConcatParameter *value_06;
  ContrastiveLossParameter *value_07;
  ConvolutionParameter *value_08;
  DataParameter *value_09;
  DropoutParameter *value_10;
  DummyDataParameter *value_11;
  EltwiseParameter *value_12;
  ExpParameter *value_13;
  HDF5DataParameter *value_14;
  HDF5OutputParameter *value_15;
  HingeLossParameter *value_16;
  ImageDataParameter *value_17;
  InfogainLossParameter *value_18;
  InnerProductParameter *value_19;
  LRNParameter *value_20;
  MemoryDataParameter *value_21;
  MVNParameter *value_22;
  PoolingParameter *value_23;
  PowerParameter *value_24;
  ReLUParameter *value_25;
  SigmoidParameter *value_26;
  SoftmaxParameter *value_27;
  SliceParameter *value_28;
  TanHParameter *value_29;
  ThresholdParameter *value_30;
  WindowDataParameter *value_31;
  PythonParameter *value_32;
  PReLUParameter *value_33;
  SPPParameter *value_34;
  ReshapeParameter *value_35;
  LogParameter *value_36;
  FlattenParameter *value_37;
  ReductionParameter *value_38;
  EmbedParameter *value_39;
  TileParameter *value_40;
  BatchNormParameter *value_41;
  ELUParameter *value_42;
  BiasParameter *value_43;
  ScaleParameter *value_44;
  InputParameter *value_45;
  CropParameter *value_46;
  ParameterParameter *value_47;
  RecurrentParameter *value_48;
  UnknownFieldSet *pUVar12;
  bool local_8a;
  bool local_89;
  Phase local_78;
  uint local_74;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  LayerParameter *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x100018e9 = input;
LAB_0077268b:
  do {
    _first_byte_or_zero = stack0xffffffffffffff98;
    kMax1ByteVarint = 0x3fff;
    tag_2 = 0;
    if (stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) {
      tag_2 = (uint32)*stack0xffffffffffffff98->buffer_;
      if ((char)*stack0xffffffffffffff98->buffer_ < '\x01') {
        if ((stack0xffffffffffffff98->buffer_end_ <= stack0xffffffffffffff98->buffer_ + 1) ||
           ((*stack0xffffffffffffff98->buffer_ & (stack0xffffffffffffff98->buffer_[1] ^ 0xff)) <
            0x80)) goto LAB_0077280a;
        uStack_30 = 0x3fff;
        tag_1 = (uint)stack0xffffffffffffff98->buffer_[1] * 0x80 +
                (*stack0xffffffffffffff98->buffer_ - 0x80);
        google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,2);
        local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
        local_35 = local_8a;
        pVar6 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
        local_10 = pVar6.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar6.second);
      }
      else {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
        google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar6 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar6.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar6.second);
      }
    }
    else {
LAB_0077280a:
      local_3c = google::protobuf::io::CodedInputStream::ReadTagFallback
                           (stack0xffffffffffffff98,tag_2);
      local_3d = local_3c - 1 < kMax1ByteVarint;
      pVar6 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
      local_10 = pVar6.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar6.second);
    }
    value._0_1_ = (undefined1)uStack_c;
    local_74 = local_10;
    p.first = local_74;
    if ((uStack_c & 1) == 0) goto LAB_00773aca;
    iVar4 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    pCVar1 = stack0xffffffffffffff98;
    switch(iVar4) {
    case 1:
      if ((p.first & 0xff) != 10) goto LAB_00773aca;
      psVar7 = mutable_name_abi_cxx11_(this);
      bVar2 = google::protobuf::internal::WireFormatLite::ReadString(pCVar1,psVar7);
      if (!bVar2) {
        return false;
      }
      name_abi_cxx11_(this);
      pcVar8 = (char *)std::__cxx11::string::data();
      name_abi_cxx11_(this);
      iVar4 = std::__cxx11::string::length();
      google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                (pcVar8,iVar4,PARSE,"caffe.LayerParameter.name");
      goto LAB_0077268b;
    case 2:
      if ((p.first & 0xff) != 0x12) goto LAB_00773aca;
      psVar7 = mutable_type_abi_cxx11_(this);
      bVar2 = google::protobuf::internal::WireFormatLite::ReadString(pCVar1,psVar7);
      if (!bVar2) {
        return false;
      }
      type_abi_cxx11_(this);
      pcVar8 = (char *)std::__cxx11::string::data();
      type_abi_cxx11_(this);
      iVar4 = std::__cxx11::string::length();
      google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                (pcVar8,iVar4,PARSE,"caffe.LayerParameter.type");
      goto LAB_0077268b;
    case 3:
      if ((p.first & 0xff) != 0x1a) goto LAB_00773aca;
      psVar7 = add_bottom_abi_cxx11_(this);
      bVar2 = google::protobuf::internal::WireFormatLite::ReadString(pCVar1,psVar7);
      if (!bVar2) {
        return false;
      }
      iVar4 = bottom_size(this);
      bottom_abi_cxx11_(this,iVar4 + -1);
      pcVar8 = (char *)std::__cxx11::string::data();
      iVar4 = bottom_size(this);
      bottom_abi_cxx11_(this,iVar4 + -1);
      iVar4 = std::__cxx11::string::length();
      google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                (pcVar8,iVar4,PARSE,"caffe.LayerParameter.bottom");
      goto LAB_0077268b;
    case 4:
      if ((p.first & 0xff) != 0x22) goto LAB_00773aca;
      psVar7 = add_top_abi_cxx11_(this);
      bVar2 = google::protobuf::internal::WireFormatLite::ReadString(pCVar1,psVar7);
      if (!bVar2) {
        return false;
      }
      iVar4 = top_size(this);
      top_abi_cxx11_(this,iVar4 + -1);
      pcVar8 = (char *)std::__cxx11::string::data();
      iVar4 = top_size(this);
      top_abi_cxx11_(this,iVar4 + -1);
      iVar4 = std::__cxx11::string::length();
      google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                (pcVar8,iVar4,PARSE,"caffe.LayerParameter.top");
      goto LAB_0077268b;
    case 5:
      if ((p.first & 0xff) == 0x2d) {
        pRVar9 = mutable_loss_weight(this);
        uVar3 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (1,0x2d,pCVar1,pRVar9);
      }
      else {
        if ((p.first & 0xff) != 0x2a) goto LAB_00773aca;
        pRVar9 = mutable_loss_weight(this);
        uVar3 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitiveNoInline<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (pCVar1,pRVar9);
      }
      break;
    case 6:
      if ((p.first & 0xff) != 0x32) goto LAB_00773aca;
      value_00 = add_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::ParamSpec>
                        (pCVar1,value_00);
      break;
    case 7:
      if ((p.first & 0xff) != 0x3a) goto LAB_00773aca;
      value_01 = add_blobs(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::BlobProto>
                        (pCVar1,value_01);
      break;
    case 8:
      if ((p.first & 0xff) != 0x42) goto LAB_00773aca;
      pNVar10 = add_include(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::NetStateRule>
                        (pCVar1,pNVar10);
      break;
    case 9:
      if ((p.first & 0xff) != 0x4a) goto LAB_00773aca;
      pNVar10 = add_exclude(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::NetStateRule>
                        (pCVar1,pNVar10);
      break;
    case 10:
      if ((p.first & 0xff) != 0x50) goto LAB_00773aca;
      bVar2 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (stack0xffffffffffffff98,(int *)&local_78);
      if (!bVar2) {
        return false;
      }
      bVar2 = Phase_IsValid(local_78);
      if (bVar2) {
        set_phase(this,local_78);
      }
      else {
        pUVar12 = mutable_unknown_fields(this);
        google::protobuf::UnknownFieldSet::AddVarint(pUVar12,10,(long)(int)local_78);
      }
      goto LAB_0077268b;
    case 0xb:
      if ((p.first & 0xff) == 0x58) {
        pRVar11 = mutable_propagate_down(this);
        uVar3 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (1,0x58,pCVar1,pRVar11);
      }
      else {
        if ((p.first & 0xff) != 0x5a) goto LAB_00773aca;
        pRVar11 = mutable_propagate_down(this);
        uVar3 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitiveNoInline<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (pCVar1,pRVar11);
      }
      break;
    default:
LAB_00773aca:
      if ((p.first == 0) ||
         (WVar5 = google::protobuf::internal::WireFormatLite::GetTagWireType(p.first),
         pCVar1 = stack0xffffffffffffff98, tag_00 = p.first, WVar5 == WIRETYPE_END_GROUP)) {
        return true;
      }
      pUVar12 = mutable_unknown_fields(this);
      uVar3 = google::protobuf::internal::WireFormat::SkipField(pCVar1,tag_00,pUVar12);
      break;
    case 100:
      if ((p.first & 0xff) != 0x22) goto LAB_00773aca;
      value_02 = mutable_transform_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::TransformationParameter>(pCVar1,value_02);
      break;
    case 0x65:
      if ((p.first & 0xff) != 0x2a) goto LAB_00773aca;
      value_03 = mutable_loss_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::LossParameter>
                        (pCVar1,value_03);
      break;
    case 0x66:
      if ((p.first & 0xff) != 0x32) goto LAB_00773aca;
      value_04 = mutable_accuracy_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::AccuracyParameter>(pCVar1,value_04);
      break;
    case 0x67:
      if ((p.first & 0xff) != 0x3a) goto LAB_00773aca;
      value_05 = mutable_argmax_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ArgMaxParameter>(pCVar1,value_05);
      break;
    case 0x68:
      if ((p.first & 0xff) != 0x42) goto LAB_00773aca;
      value_06 = mutable_concat_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ConcatParameter>(pCVar1,value_06);
      break;
    case 0x69:
      if ((p.first & 0xff) != 0x4a) goto LAB_00773aca;
      value_07 = mutable_contrastive_loss_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ContrastiveLossParameter>(pCVar1,value_07);
      break;
    case 0x6a:
      if ((p.first & 0xff) != 0x52) goto LAB_00773aca;
      value_08 = mutable_convolution_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ConvolutionParameter>(pCVar1,value_08);
      break;
    case 0x6b:
      if ((p.first & 0xff) != 0x5a) goto LAB_00773aca;
      value_09 = mutable_data_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::DataParameter>
                        (pCVar1,value_09);
      break;
    case 0x6c:
      if ((p.first & 0xff) != 0x62) goto LAB_00773aca;
      value_10 = mutable_dropout_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::DropoutParameter>(pCVar1,value_10);
      break;
    case 0x6d:
      if ((p.first & 0xff) != 0x6a) goto LAB_00773aca;
      value_11 = mutable_dummy_data_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::DummyDataParameter>(pCVar1,value_11);
      break;
    case 0x6e:
      if ((p.first & 0xff) != 0x72) goto LAB_00773aca;
      value_12 = mutable_eltwise_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::EltwiseParameter>(pCVar1,value_12);
      break;
    case 0x6f:
      if ((p.first & 0xff) != 0x7a) goto LAB_00773aca;
      value_13 = mutable_exp_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::ExpParameter>
                        (pCVar1,value_13);
      break;
    case 0x70:
      if ((p.first & 0xff) != 0x82) goto LAB_00773aca;
      value_14 = mutable_hdf5_data_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::HDF5DataParameter>(pCVar1,value_14);
      break;
    case 0x71:
      if ((p.first & 0xff) != 0x8a) goto LAB_00773aca;
      value_15 = mutable_hdf5_output_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::HDF5OutputParameter>(pCVar1,value_15);
      break;
    case 0x72:
      if ((p.first & 0xff) != 0x92) goto LAB_00773aca;
      value_16 = mutable_hinge_loss_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::HingeLossParameter>(pCVar1,value_16);
      break;
    case 0x73:
      if ((p.first & 0xff) != 0x9a) goto LAB_00773aca;
      value_17 = mutable_image_data_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ImageDataParameter>(pCVar1,value_17);
      break;
    case 0x74:
      if ((p.first & 0xff) != 0xa2) goto LAB_00773aca;
      value_18 = mutable_infogain_loss_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::InfogainLossParameter>(pCVar1,value_18);
      break;
    case 0x75:
      if ((p.first & 0xff) != 0xaa) goto LAB_00773aca;
      value_19 = mutable_inner_product_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::InnerProductParameter>(pCVar1,value_19);
      break;
    case 0x76:
      if ((p.first & 0xff) != 0xb2) goto LAB_00773aca;
      value_20 = mutable_lrn_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::LRNParameter>
                        (pCVar1,value_20);
      break;
    case 0x77:
      if ((p.first & 0xff) != 0xba) goto LAB_00773aca;
      value_21 = mutable_memory_data_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::MemoryDataParameter>(pCVar1,value_21);
      break;
    case 0x78:
      if ((p.first & 0xff) != 0xc2) goto LAB_00773aca;
      value_22 = mutable_mvn_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::MVNParameter>
                        (pCVar1,value_22);
      break;
    case 0x79:
      if ((p.first & 0xff) != 0xca) goto LAB_00773aca;
      value_23 = mutable_pooling_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::PoolingParameter>(pCVar1,value_23);
      break;
    case 0x7a:
      if ((p.first & 0xff) != 0xd2) goto LAB_00773aca;
      value_24 = mutable_power_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::PowerParameter>(pCVar1,value_24);
      break;
    case 0x7b:
      if ((p.first & 0xff) != 0xda) goto LAB_00773aca;
      value_25 = mutable_relu_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::ReLUParameter>
                        (pCVar1,value_25);
      break;
    case 0x7c:
      if ((p.first & 0xff) != 0xe2) goto LAB_00773aca;
      value_26 = mutable_sigmoid_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::SigmoidParameter>(pCVar1,value_26);
      break;
    case 0x7d:
      if ((p.first & 0xff) != 0xea) goto LAB_00773aca;
      value_27 = mutable_softmax_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::SoftmaxParameter>(pCVar1,value_27);
      break;
    case 0x7e:
      if ((p.first & 0xff) != 0xf2) goto LAB_00773aca;
      value_28 = mutable_slice_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::SliceParameter>(pCVar1,value_28);
      break;
    case 0x7f:
      if ((p.first & 0xff) != 0xfa) goto LAB_00773aca;
      value_29 = mutable_tanh_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::TanHParameter>
                        (pCVar1,value_29);
      break;
    case 0x80:
      if ((p.first & 0xff) != 2) goto LAB_00773aca;
      value_30 = mutable_threshold_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ThresholdParameter>(pCVar1,value_30);
      break;
    case 0x81:
      if ((p.first & 0xff) != 10) goto LAB_00773aca;
      value_31 = mutable_window_data_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::WindowDataParameter>(pCVar1,value_31);
      break;
    case 0x82:
      if ((p.first & 0xff) != 0x12) goto LAB_00773aca;
      value_32 = mutable_python_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::PythonParameter>(pCVar1,value_32);
      break;
    case 0x83:
      if ((p.first & 0xff) != 0x1a) goto LAB_00773aca;
      value_33 = mutable_prelu_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::PReLUParameter>(pCVar1,value_33);
      break;
    case 0x84:
      if ((p.first & 0xff) != 0x22) goto LAB_00773aca;
      value_34 = mutable_spp_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::SPPParameter>
                        (pCVar1,value_34);
      break;
    case 0x85:
      if ((p.first & 0xff) != 0x2a) goto LAB_00773aca;
      value_35 = mutable_reshape_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ReshapeParameter>(pCVar1,value_35);
      break;
    case 0x86:
      if ((p.first & 0xff) != 0x32) goto LAB_00773aca;
      value_36 = mutable_log_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::LogParameter>
                        (pCVar1,value_36);
      break;
    case 0x87:
      if ((p.first & 0xff) != 0x3a) goto LAB_00773aca;
      value_37 = mutable_flatten_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::FlattenParameter>(pCVar1,value_37);
      break;
    case 0x88:
      if ((p.first & 0xff) != 0x42) goto LAB_00773aca;
      value_38 = mutable_reduction_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ReductionParameter>(pCVar1,value_38);
      break;
    case 0x89:
      if ((p.first & 0xff) != 0x4a) goto LAB_00773aca;
      value_39 = mutable_embed_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::EmbedParameter>(pCVar1,value_39);
      break;
    case 0x8a:
      if ((p.first & 0xff) != 0x52) goto LAB_00773aca;
      value_40 = mutable_tile_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::TileParameter>
                        (pCVar1,value_40);
      break;
    case 0x8b:
      if ((p.first & 0xff) != 0x5a) goto LAB_00773aca;
      value_41 = mutable_batch_norm_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::BatchNormParameter>(pCVar1,value_41);
      break;
    case 0x8c:
      if ((p.first & 0xff) != 0x62) goto LAB_00773aca;
      value_42 = mutable_elu_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::ELUParameter>
                        (pCVar1,value_42);
      break;
    case 0x8d:
      if ((p.first & 0xff) != 0x6a) goto LAB_00773aca;
      value_43 = mutable_bias_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::BiasParameter>
                        (pCVar1,value_43);
      break;
    case 0x8e:
      if ((p.first & 0xff) != 0x72) goto LAB_00773aca;
      value_44 = mutable_scale_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ScaleParameter>(pCVar1,value_44);
      break;
    case 0x8f:
      if ((p.first & 0xff) != 0x7a) goto LAB_00773aca;
      value_45 = mutable_input_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::InputParameter>(pCVar1,value_45);
      break;
    case 0x90:
      if ((p.first & 0xff) != 0x82) goto LAB_00773aca;
      value_46 = mutable_crop_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::CropParameter>
                        (pCVar1,value_46);
      break;
    case 0x91:
      if ((p.first & 0xff) != 0x8a) goto LAB_00773aca;
      value_47 = mutable_parameter_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ParameterParameter>(pCVar1,value_47);
      break;
    case 0x92:
      if ((p.first & 0xff) != 0x92) goto LAB_00773aca;
      value_48 = mutable_recurrent_param(this);
      uVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::RecurrentParameter>(pCVar1,value_48);
    }
    if (!(bool)uVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool LayerParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.LayerParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string type = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->type().data(), this->type().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.type");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string bottom = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_bottom()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->bottom(this->bottom_size() - 1).data(),
            this->bottom(this->bottom_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.bottom");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string top = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_top()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->top(this->top_size() - 1).data(),
            this->top(this->top_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.top");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated float loss_weight = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 45u, input, this->mutable_loss_weight())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(42u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_loss_weight())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.ParamSpec param = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.BlobProto blobs = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_blobs()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.NetStateRule include = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_include()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.NetStateRule exclude = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_exclude()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.Phase phase = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::Phase_IsValid(value)) {
            set_phase(static_cast< ::caffe::Phase >(value));
          } else {
            mutable_unknown_fields()->AddVarint(10, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool propagate_down = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 88u, input, this->mutable_propagate_down())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(90u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_propagate_down())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.TransformationParameter transform_param = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_transform_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LossParameter loss_param = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.AccuracyParameter accuracy_param = 102;
      case 102: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(818u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_accuracy_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ArgMaxParameter argmax_param = 103;
      case 103: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(826u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_argmax_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ConcatParameter concat_param = 104;
      case 104: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(834u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_concat_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ContrastiveLossParameter contrastive_loss_param = 105;
      case 105: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(842u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_contrastive_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ConvolutionParameter convolution_param = 106;
      case 106: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(850u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_convolution_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.DataParameter data_param = 107;
      case 107: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(858u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.DropoutParameter dropout_param = 108;
      case 108: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(866u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dropout_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.DummyDataParameter dummy_data_param = 109;
      case 109: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(874u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dummy_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.EltwiseParameter eltwise_param = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_eltwise_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ExpParameter exp_param = 111;
      case 111: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(890u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_exp_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.HDF5DataParameter hdf5_data_param = 112;
      case 112: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(898u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_hdf5_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.HDF5OutputParameter hdf5_output_param = 113;
      case 113: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(906u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_hdf5_output_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.HingeLossParameter hinge_loss_param = 114;
      case 114: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(914u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_hinge_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ImageDataParameter image_data_param = 115;
      case 115: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(922u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_image_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.InfogainLossParameter infogain_loss_param = 116;
      case 116: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(930u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_infogain_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.InnerProductParameter inner_product_param = 117;
      case 117: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(938u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inner_product_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LRNParameter lrn_param = 118;
      case 118: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(946u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_lrn_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.MemoryDataParameter memory_data_param = 119;
      case 119: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(954u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_memory_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.MVNParameter mvn_param = 120;
      case 120: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(962u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_mvn_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PoolingParameter pooling_param = 121;
      case 121: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(970u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pooling_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PowerParameter power_param = 122;
      case 122: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(978u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_power_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReLUParameter relu_param = 123;
      case 123: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(986u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_relu_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SigmoidParameter sigmoid_param = 124;
      case 124: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sigmoid_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SoftmaxParameter softmax_param = 125;
      case 125: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_softmax_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SliceParameter slice_param = 126;
      case 126: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1010u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_slice_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.TanHParameter tanh_param = 127;
      case 127: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1018u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_tanh_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ThresholdParameter threshold_param = 128;
      case 128: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1026u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_threshold_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.WindowDataParameter window_data_param = 129;
      case 129: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1034u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_window_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PythonParameter python_param = 130;
      case 130: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1042u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_python_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PReLUParameter prelu_param = 131;
      case 131: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1050u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_prelu_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SPPParameter spp_param = 132;
      case 132: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1058u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_spp_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReshapeParameter reshape_param = 133;
      case 133: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1066u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_reshape_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LogParameter log_param = 134;
      case 134: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1074u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_log_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FlattenParameter flatten_param = 135;
      case 135: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1082u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_flatten_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReductionParameter reduction_param = 136;
      case 136: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1090u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_reduction_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.EmbedParameter embed_param = 137;
      case 137: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1098u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_embed_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.TileParameter tile_param = 138;
      case 138: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_tile_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.BatchNormParameter batch_norm_param = 139;
      case 139: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1114u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_batch_norm_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ELUParameter elu_param = 140;
      case 140: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_elu_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.BiasParameter bias_param = 141;
      case 141: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1130u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ScaleParameter scale_param = 142;
      case 142: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1138u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_scale_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.InputParameter input_param = 143;
      case 143: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1146u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_input_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.CropParameter crop_param = 144;
      case 144: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1154u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_crop_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ParameterParameter parameter_param = 145;
      case 145: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_parameter_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.RecurrentParameter recurrent_param = 146;
      case 146: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_recurrent_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.LayerParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.LayerParameter)
  return false;
#undef DO_
}